

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::HostAddress::HostAddress(HostAddress *this,IPv6Address *ip6Address)

{
  undefined8 uVar1;
  
  this->m_protocol = UnknownNetworkProtocol;
  this->m_ip4Address = 0;
  (this->m_ip6Address).data[0] = '\0';
  (this->m_ip6Address).data[1] = '\0';
  (this->m_ip6Address).data[2] = '\0';
  (this->m_ip6Address).data[3] = '\0';
  (this->m_ip6Address).data[4] = '\0';
  (this->m_ip6Address).data[5] = '\0';
  (this->m_ip6Address).data[6] = '\0';
  (this->m_ip6Address).data[7] = '\0';
  (this->m_ip6Address).data[8] = '\0';
  (this->m_ip6Address).data[9] = '\0';
  (this->m_ip6Address).data[10] = '\0';
  (this->m_ip6Address).data[0xb] = '\0';
  (this->m_ip6Address).data[0xc] = '\0';
  (this->m_ip6Address).data[0xd] = '\0';
  (this->m_ip6Address).data[0xe] = '\0';
  (this->m_ip6Address).data[0xf] = '\0';
  (this->m_ipString)._M_dataplus._M_p = (pointer)&(this->m_ipString).field_2;
  (this->m_ipString)._M_string_length = 0;
  (this->m_ipString).field_2._M_local_buf[0] = '\0';
  this->m_hasIpAddress = true;
  uVar1 = *(undefined8 *)(ip6Address->data + 8);
  *(undefined8 *)(this->m_ip6Address).data = *(undefined8 *)ip6Address->data;
  *(undefined8 *)((this->m_ip6Address).data + 8) = uVar1;
  this->m_protocol = IPv6Protocol;
  this->m_ip4Address = 0;
  this->m_hasIpAddress = true;
  return;
}

Assistant:

HostAddress::HostAddress(const IPv6Address& ip6Address)
    : m_protocol(HostAddress::UnknownNetworkProtocol)
    , m_ip4Address(0)
    , m_hasIpAddress(true)
{
    SetAddress(ip6Address);
}